

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O2

CURLcode Curl_ssl_addsessionid(connectdata *conn,void *ssl_sessionid,size_t idsize,int sockindex)

{
  Curl_easy *pCVar1;
  Curl_share *pCVar2;
  ulong uVar3;
  curl_ssl_session *pcVar4;
  long lVar5;
  _Bool _Var6;
  int iVar7;
  long lVar8;
  char *pcVar9;
  char *pcVar10;
  ulong uVar11;
  byte bVar12;
  ulong uVar13;
  curl_ssl_session *session;
  long *plVar14;
  long lVar15;
  long lVar16;
  
  pCVar1 = conn->data;
  session = (pCVar1->state).session;
  if ((conn->http_proxy).proxytype == CURLPROXY_HTTPS) {
    _Var6 = (conn->bits).proxy_ssl_connected[sockindex];
    lVar16 = 0x340;
    if (_Var6 != false) {
      lVar16 = 0x2f8;
    }
    lVar8 = 0x160;
    if (_Var6 != false) {
      lVar8 = 0xd8;
    }
    bVar12 = _Var6 ^ 1;
  }
  else {
    lVar8 = 0xd8;
    lVar16 = 0x2f8;
    bVar12 = 0;
  }
  lVar15 = session->age;
  pcVar9 = (*Curl_cstrdup)(*(char **)((conn->chunk).hexbuffer + lVar8 + -0x20));
  if (pcVar9 == (char *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  if ((conn->bits).conn_to_host == true) {
    pcVar10 = (*Curl_cstrdup)((conn->conn_to_host).name);
    if (pcVar10 == (char *)0x0) {
      (*Curl_cfree)(pcVar9);
      return CURLE_OUT_OF_MEMORY;
    }
  }
  else {
    pcVar10 = (char *)0x0;
  }
  if ((conn->bits).conn_to_port == true) {
    iVar7 = conn->conn_to_port;
  }
  else {
    iVar7 = -1;
  }
  pCVar2 = pCVar1->share;
  if ((pCVar2 == (Curl_share *)0x0) || ((pCVar2->specifier & 0x10) == 0)) {
    plVar14 = &(pCVar1->state).sessionage;
  }
  else {
    plVar14 = &pCVar2->sessionage;
  }
  uVar3 = (pCVar1->set).general_ssl.max_ssl_sessions;
  uVar13 = 1;
  for (lVar8 = 0x80;
      (uVar11 = uVar3 + (uVar3 == 0), uVar13 < uVar3 &&
      (pcVar4 = (pCVar1->state).session, uVar11 = uVar13,
      *(long *)((long)&pcVar4->sessionid + lVar8) != 0)); lVar8 = lVar8 + 0x80) {
    lVar5 = *(long *)((long)&pcVar4->age + lVar8);
    if (lVar5 < lVar15) {
      session = (curl_ssl_session *)((long)&pcVar4->name + lVar8);
      lVar15 = lVar5;
    }
    uVar13 = uVar13 + 1;
  }
  if (uVar11 == uVar3) {
    Curl_ssl_kill_session(session);
  }
  else {
    session = (pCVar1->state).session + uVar11;
  }
  session->sessionid = ssl_sessionid;
  session->idsize = idsize;
  session->age = *plVar14;
  (*Curl_cfree)(session->name);
  (*Curl_cfree)(session->conn_to_host);
  session->name = pcVar9;
  session->conn_to_host = pcVar10;
  session->conn_to_port = iVar7;
  if (bVar12 == 0) {
    iVar7 = conn->remote_port;
  }
  else {
    iVar7 = (int)conn->port;
  }
  session->remote_port = iVar7;
  session->scheme = conn->handler->scheme;
  _Var6 = Curl_clone_primary_ssl_config
                    ((ssl_primary_config *)((conn->chunk).hexbuffer + lVar16 + -0x20),
                     &session->ssl_config);
  if (!_Var6) {
    session->sessionid = (void *)0x0;
    (*Curl_cfree)(pcVar9);
    (*Curl_cfree)(pcVar10);
    return CURLE_OUT_OF_MEMORY;
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_ssl_addsessionid(struct connectdata *conn,
                               void *ssl_sessionid,
                               size_t idsize,
                               int sockindex)
{
  size_t i;
  struct Curl_easy *data = conn->data; /* the mother of all structs */
  struct curl_ssl_session *store = &data->state.session[0];
  long oldest_age = data->state.session[0].age; /* zero if unused */
  char *clone_host;
  char *clone_conn_to_host;
  int conn_to_port;
  long *general_age;
  const bool isProxy = CONNECT_PROXY_SSL();
  struct ssl_primary_config * const ssl_config = isProxy ?
    &conn->proxy_ssl_config :
    &conn->ssl_config;

  DEBUGASSERT(SSL_SET_OPTION(primary.sessionid));

  clone_host = strdup(isProxy ? conn->http_proxy.host.name : conn->host.name);
  if(!clone_host)
    return CURLE_OUT_OF_MEMORY; /* bail out */

  if(conn->bits.conn_to_host) {
    clone_conn_to_host = strdup(conn->conn_to_host.name);
    if(!clone_conn_to_host) {
      free(clone_host);
      return CURLE_OUT_OF_MEMORY; /* bail out */
    }
  }
  else
    clone_conn_to_host = NULL;

  if(conn->bits.conn_to_port)
    conn_to_port = conn->conn_to_port;
  else
    conn_to_port = -1;

  /* Now we should add the session ID and the host name to the cache, (remove
     the oldest if necessary) */

  /* If using shared SSL session, lock! */
  if(SSLSESSION_SHARED(data)) {
    general_age = &data->share->sessionage;
  }
  else {
    general_age = &data->state.sessionage;
  }

  /* find an empty slot for us, or find the oldest */
  for(i = 1; (i < data->set.general_ssl.max_ssl_sessions) &&
        data->state.session[i].sessionid; i++) {
    if(data->state.session[i].age < oldest_age) {
      oldest_age = data->state.session[i].age;
      store = &data->state.session[i];
    }
  }
  if(i == data->set.general_ssl.max_ssl_sessions)
    /* cache is full, we must "kill" the oldest entry! */
    Curl_ssl_kill_session(store);
  else
    store = &data->state.session[i]; /* use this slot */

  /* now init the session struct wisely */
  store->sessionid = ssl_sessionid;
  store->idsize = idsize;
  store->age = *general_age;    /* set current age */
  /* free it if there's one already present */
  free(store->name);
  free(store->conn_to_host);
  store->name = clone_host;               /* clone host name */
  store->conn_to_host = clone_conn_to_host; /* clone connect to host name */
  store->conn_to_port = conn_to_port; /* connect to port number */
  /* port number */
  store->remote_port = isProxy ? (int)conn->port : conn->remote_port;
  store->scheme = conn->handler->scheme;

  if(!Curl_clone_primary_ssl_config(ssl_config, &store->ssl_config)) {
    store->sessionid = NULL; /* let caller free sessionid */
    free(clone_host);
    free(clone_conn_to_host);
    return CURLE_OUT_OF_MEMORY;
  }

  return CURLE_OK;
}